

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void rapidjson::internal::
     Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
     ::AssignIfExist(SizeType *out,ValueType *value,ValueType *name)

{
  ValueType *this;
  uint64_t uVar1;
  
  this = GetMember(value,name);
  if ((this != (ValueType *)0x0) &&
     ((undefined1  [16])((undefined1  [16])this->data_ & (undefined1  [16])0x100000000000000) !=
      (undefined1  [16])0x0)) {
    uVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint64(this);
    if (uVar1 >> 0x20 == 0) {
      uVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint64(this);
      *out = (SizeType)uVar1;
    }
  }
  return;
}

Assistant:

static void AssignIfExist(SizeType& out, const ValueType& value, const ValueType& name) {
        if (const ValueType* v = GetMember(value, name))
            if (v->IsUint64() && v->GetUint64() <= SizeType(~0))
                out = static_cast<SizeType>(v->GetUint64());
    }